

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O3

void __thiscall
hungarian_algorithm::HungarianSolver<double,_unsigned_long,_std::less<double>_>::
subtractSmallestUncoveredElement(HungarianSolver<double,_unsigned_long,_std::less<double>_> *this)

{
  ulong *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  logic_error *this_00;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pdVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  size_t col;
  ulong uVar15;
  double dVar16;
  double dVar17;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar8 = *(ulong *)this;
  if (uVar8 != 0) {
    dVar16 = this->zero_cost_;
    uVar10 = *(ulong *)&this->field_0x8;
    pdVar11 = (this->cost_matrix_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar9 = 0;
    bVar7 = false;
    do {
      uVar15 = uVar9 + 0x3f;
      if (-1 < (long)uVar9) {
        uVar15 = uVar9;
      }
      if ((*(ulong *)(*(long *)&this->field_0x10 + ((long)uVar15 >> 6) * 8 + -8 +
                     (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
           (uVar9 & 0x3f) & 1) == 0 && uVar10 != 0) {
        uVar15 = 0;
        dVar17 = dVar16;
        do {
          uVar12 = uVar15 + 0x3f;
          if (-1 < (long)uVar15) {
            uVar12 = uVar15;
          }
          dVar16 = dVar17;
          if ((*(ulong *)(*(long *)&this->field_0x38 + ((long)uVar12 >> 6) * 8 + -8 +
                         (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar15 & 0x3f) & 1) == 0) {
            dVar16 = pdVar11[uVar15];
            if (bVar7) {
              if (dVar17 <= dVar16) {
                dVar16 = dVar17;
              }
            }
            else {
              bVar7 = true;
            }
          }
          uVar15 = uVar15 + 1;
          dVar17 = dVar16;
        } while (uVar10 != uVar15);
      }
      uVar9 = uVar9 + 1;
      pdVar11 = pdVar11 + uVar10;
    } while (uVar9 != uVar8);
    if (bVar7) {
      uVar10 = *(ulong *)&this->field_0x8;
      lVar4 = *(long *)&this->field_0x10;
      uVar9 = 0;
      lVar14 = 0;
      do {
        if (uVar10 == 0) {
          uVar10 = 0;
        }
        else {
          uVar8 = uVar9 + 0x3f;
          if (-1 < (long)uVar9) {
            uVar8 = uVar9;
          }
          lVar5 = *(long *)&this->field_0x38;
          lVar6 = *(long *)&this->field_0x60;
          pdVar11 = (this->cost_matrix_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
          uVar15 = 0;
          do {
            uVar10 = lVar14 + uVar15;
            uVar12 = uVar15 + 0x3f;
            if (-1 < (long)uVar15) {
              uVar12 = uVar15;
            }
            uVar12 = 1L << ((byte)uVar15 & 0x3f) &
                     *(ulong *)(lVar5 + ((long)uVar12 >> 6) * 8 + -8 +
                               (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) * 8);
            if ((*(ulong *)(lVar4 + ((long)uVar8 >> 6) * 8 +
                           (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8) &
                1L << ((byte)uVar9 & 0x3f)) == 0) {
              if (uVar12 == 0) {
                dVar17 = pdVar11[lVar14 + uVar15] - dVar16;
                goto LAB_0011d18d;
              }
            }
            else if (uVar12 != 0) {
              dVar17 = pdVar11[lVar14 + uVar15] + dVar16;
LAB_0011d18d:
              uVar12 = uVar10 + 0x3f;
              if (-1 < (long)uVar10) {
                uVar12 = uVar10;
              }
              uVar13 = 1L << ((byte)uVar10 & 0x3f);
              pdVar11[lVar14 + uVar15] = dVar17;
              lVar3 = lVar6 + ((long)uVar12 >> 6) * 8;
              lVar2 = (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
              if ((dVar17 != this->zero_cost_) || (NAN(dVar17) || NAN(this->zero_cost_))) {
                puVar1 = (ulong *)(lVar3 + lVar2);
                *puVar1 = *puVar1 & ~uVar13;
              }
              else {
                puVar1 = (ulong *)(lVar3 + lVar2);
                *puVar1 = *puVar1 | uVar13;
              }
            }
            uVar15 = uVar15 + 1;
            uVar10 = *(ulong *)&this->field_0x8;
          } while (uVar15 < uVar10);
          uVar8 = *(ulong *)this;
          lVar14 = lVar14 + uVar15;
        }
        uVar9 = uVar9 + 1;
        if (uVar8 <= uVar9) {
          return;
        }
      } while( true );
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Hungarian algorithm: !found_minimum; this should never happen","");
  std::logic_error::logic_error(this_00,(string *)local_50);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void subtractSmallestUncoveredElement()
  {
    // Find smallest uncovered element:
    bool found_minimum = false;
    Cost h = zero_cost_;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      if (!covered_rows_[row])
      {
        for (std::size_t col = 0; col < num_cols_; ++col)
        {
          if (!covered_cols_[col])
          {
            if (!found_minimum)
            {
              h = cost_matrix_[getIndex(row, col)];
              found_minimum = true;
            }
            else
            {
              h = std::min(h, cost_matrix_[getIndex(row, col)]);
            }
          }
        }
      }
    }

    if (!found_minimum)
    {
      throw std::logic_error("Hungarian algorithm: !found_minimum; this should never happen");
    }

    // Subtract h from each uncovered element, and add h to each doubly covered element:
    std::size_t i = 0;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      for (std::size_t col = 0; col < num_cols_; ++col, ++i)
      {
        if (covered_rows_[row] && covered_cols_[col])
        {
          cost_matrix_[i] += h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
        else if (!covered_rows_[row] && !covered_cols_[col])
        {
          cost_matrix_[i] -= h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
      }
    }
  }